

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O3

Roaring * roaring::Roaring::fastunion(Roaring *__return_storage_ptr__,size_t n,Roaring **inputs)

{
  container_s **ppcVar1;
  uint8_t *puVar2;
  undefined7 uVar3;
  int32_t iVar4;
  int32_t iVar5;
  roaring_bitmap_t **x;
  size_t sVar6;
  roaring_bitmap_t *__ptr;
  runtime_error *this;
  
  x = (roaring_bitmap_t **)roaring_malloc(n * 8);
  if (x == (roaring_bitmap_t **)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"failed memory alloc in fastunion");
  }
  else {
    if (n != 0) {
      sVar6 = 0;
      do {
        x[sVar6] = (roaring_bitmap_t *)inputs[sVar6];
        sVar6 = sVar6 + 1;
      } while (n != sVar6);
    }
    __ptr = roaring_bitmap_or_many(n,x);
    if (__ptr != (roaring_bitmap_t *)0x0) {
      uVar3 = *(undefined7 *)&(__ptr->high_low_container).field_0x21;
      (__return_storage_ptr__->roaring).high_low_container.flags = (__ptr->high_low_container).flags
      ;
      *(undefined7 *)&(__return_storage_ptr__->roaring).high_low_container.field_0x21 = uVar3;
      iVar4 = (__ptr->high_low_container).size;
      iVar5 = (__ptr->high_low_container).allocation_size;
      ppcVar1 = (container_s **)(__ptr->high_low_container).containers;
      puVar2 = (__ptr->high_low_container).typecodes;
      (__return_storage_ptr__->roaring).high_low_container.keys = (__ptr->high_low_container).keys;
      (__return_storage_ptr__->roaring).high_low_container.typecodes = puVar2;
      (__return_storage_ptr__->roaring).high_low_container.size = iVar4;
      (__return_storage_ptr__->roaring).high_low_container.allocation_size = iVar5;
      (__return_storage_ptr__->roaring).high_low_container.containers = ppcVar1;
      roaring_free(__ptr);
      roaring_free(x);
      return __return_storage_ptr__;
    }
    roaring_free(x);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"failed memory alloc in fastunion");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Roaring fastunion(size_t n, const Roaring **inputs) {
        const roaring_bitmap_t **x = (const roaring_bitmap_t **)roaring_malloc(
            n * sizeof(roaring_bitmap_t *));
        if (x == NULL) {
            ROARING_TERMINATE("failed memory alloc in fastunion");
        }
        for (size_t k = 0; k < n; ++k) x[k] = &inputs[k]->roaring;

        roaring_bitmap_t *c_ans = api::roaring_bitmap_or_many(n, x);
        if (c_ans == NULL) {
            roaring_free(x);
            ROARING_TERMINATE("failed memory alloc in fastunion");
        }
        Roaring ans(c_ans);
        roaring_free(x);
        return ans;
    }